

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void websocket_on_unsubscribe(void *u1,void *u2)

{
  websocket_sub_data_s *d;
  void *u2_local;
  void *u1_local;
  
  if (*(long *)((long)u2 + 8) != 0) {
    (**(code **)((long)u2 + 8))(*(undefined8 *)((long)u2 + 0x10));
  }
  if (*u2 == -0x20) {
    websocket_optimize4broadcasts(-0x20,0);
  }
  else if (*u2 == -0x21) {
    websocket_optimize4broadcasts(-0x21,0);
  }
  else if (*u2 == -0x22) {
    websocket_optimize4broadcasts(-0x22,0);
  }
  free(u2);
  return;
}

Assistant:

static void websocket_on_unsubscribe(void *u1, void *u2) {
  websocket_sub_data_s *d = u2;
  if (d->on_unsubscribe) {
    d->on_unsubscribe(d->udata);
  }

  if ((intptr_t)d->on_message == (intptr_t)WEBSOCKET_OPTIMIZE_PUBSUB) {
    websocket_optimize4broadcasts(WEBSOCKET_OPTIMIZE_PUBSUB, 0);
  } else if ((intptr_t)d->on_message ==
             (intptr_t)WEBSOCKET_OPTIMIZE_PUBSUB_TEXT) {
    websocket_optimize4broadcasts(WEBSOCKET_OPTIMIZE_PUBSUB_TEXT, 0);
  } else if ((intptr_t)d->on_message ==
             (intptr_t)WEBSOCKET_OPTIMIZE_PUBSUB_BINARY) {
    websocket_optimize4broadcasts(WEBSOCKET_OPTIMIZE_PUBSUB_BINARY, 0);
  }
  free(d);
  (void)u1;
}